

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

ResourceData *
getFallbackData(UResourceBundle *resBundle,char **resTag,UResourceDataEntry **realData,Resource *res
               ,UErrorCode *status)

{
  char *__s1;
  UErrorCode UVar1;
  int iVar2;
  char *__s2;
  bool bVar3;
  uint local_48;
  int32_t local_44;
  int32_t i;
  int32_t indexR;
  UResourceDataEntry *resB;
  UErrorCode *status_local;
  Resource *res_local;
  UResourceDataEntry **realData_local;
  char **resTag_local;
  UResourceBundle *resBundle_local;
  
  _i = resBundle->fData;
  local_44 = -1;
  *res = 0xffffffff;
  if (_i == (UResourceDataEntry *)0x0) {
    *status = U_MISSING_RESOURCE_ERROR;
    resBundle_local = (UResourceBundle *)0x0;
  }
  else {
    bVar3 = _i->fBogus == U_ZERO_ERROR;
    resB = (UResourceDataEntry *)status;
    status_local = (UErrorCode *)res;
    res_local = (Resource *)realData;
    realData_local = (UResourceDataEntry **)resTag;
    resTag_local = &resBundle->fKey;
    if (bVar3) {
      UVar1 = res_getTableItemByKey_63(&_i->fData,(_i->fData).rootRes,&local_44,resTag);
      *status_local = UVar1;
    }
    local_48 = (uint)bVar3;
    if (*(char *)(resTag_local + 0x16) == '\x01') {
      while( true ) {
        bVar3 = false;
        if (*status_local == ~U_ZERO_ERROR) {
          bVar3 = _i->fParent != (UResourceDataEntry *)0x0;
        }
        if (!bVar3) break;
        _i = _i->fParent;
        if (_i->fBogus == U_ZERO_ERROR) {
          local_48 = local_48 + 1;
          UVar1 = res_getTableItemByKey_63
                            (&_i->fData,(_i->fData).rootRes,&local_44,(char **)realData_local);
          *status_local = UVar1;
        }
      }
    }
    if (*status_local == ~U_ZERO_ERROR) {
      *(undefined4 *)&resB->fName = 2;
      resBundle_local = (UResourceBundle *)0x0;
    }
    else {
      if (1 < (int)local_48) {
        __s1 = _i->fName;
        __s2 = uloc_getDefault_63();
        iVar2 = strcmp(__s1,__s2);
        if ((iVar2 == 0) || (iVar2 = strcmp(_i->fName,"root"), iVar2 == 0)) {
          *(undefined4 *)&resB->fName = 0xffffff81;
        }
        else {
          *(undefined4 *)&resB->fName = 0xffffff80;
        }
      }
      *(UResourceDataEntry **)res_local = _i;
      resBundle_local = (UResourceBundle *)&_i->fData;
    }
  }
  return (ResourceData *)resBundle_local;
}

Assistant:

static const ResourceData *getFallbackData(const UResourceBundle* resBundle, const char* * resTag, UResourceDataEntry* *realData, Resource *res, UErrorCode *status) {
    UResourceDataEntry *resB = resBundle->fData;
    int32_t indexR = -1;
    int32_t i = 0;
    *res = RES_BOGUS;
    if(resB != NULL) {
        if(resB->fBogus == U_ZERO_ERROR) { /* if this resource is real, */
            *res = res_getTableItemByKey(&(resB->fData), resB->fData.rootRes, &indexR, resTag); /* try to get data from there */
            i++;
        }
        if(resBundle->fHasFallback == TRUE) {
            while(*res == RES_BOGUS && resB->fParent != NULL) { /* Otherwise, we'll look in parents */
                resB = resB->fParent;
                if(resB->fBogus == U_ZERO_ERROR) {
                    i++;
                    *res = res_getTableItemByKey(&(resB->fData), resB->fData.rootRes, &indexR, resTag);
                }
            }
        }

        if(*res != RES_BOGUS) { /* If the resource is found in parents, we need to adjust the error */
            if(i>1) {
                if(uprv_strcmp(resB->fName, uloc_getDefault())==0 || uprv_strcmp(resB->fName, kRootLocaleName)==0) {
                    *status = U_USING_DEFAULT_WARNING;
                } else {
                    *status = U_USING_FALLBACK_WARNING;
                }
            }
            *realData = resB;
            return (&(resB->fData));
        } else { /* If resource is not found, we need to give an error */
            *status = U_MISSING_RESOURCE_ERROR;
            return NULL;
        }
    } else {
            *status = U_MISSING_RESOURCE_ERROR;
            return NULL;
    }
}